

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O1

walk_result __thiscall
jsoncons::jsonschema::
minimum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
do_walk(minimum_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *param_1,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *instance,
       json_pointer *instance_location,walk_reporter_type *reporter)

{
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar1;
  int iVar2;
  walk_result wVar3;
  
  pbVar1 = (this->
           super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ).
           super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           .schema_ptr_;
  iVar2 = (*(this->
            super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            ).
            super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            .super_validation_message_factory._vptr_validation_message_factory[6])();
  if (*(long *)(reporter + 0x10) != 0) {
    wVar3 = (**(code **)(reporter + 0x18))
                      (reporter,&(this->
                                 super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                                 ).
                                 super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                                 .keyword_name_,pbVar1,iVar2,instance,instance_location);
    return wVar3;
  }
  std::__throw_bad_function_call();
}

Assistant:

walk_result do_walk(const eval_context<Json>& /*context*/, const Json& instance,
            const jsonpointer::json_pointer& instance_location, const walk_reporter_type& reporter) const final
        {
            return reporter(this->keyword_name(), this->schema(), this->schema_location(), instance, instance_location);
        }